

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O2

void oonf_class_event(oonf_class *c,void *ptr,oonf_class_event evt)

{
  char *pcVar1;
  char *pcVar2;
  list_entity *plVar3;
  undefined8 uVar4;
  ulong uVar5;
  list_entity *plVar6;
  oonf_objectkey_str buf;
  
  uVar5 = (ulong)_oonf_class_subsystem.logging;
  if (((&log_global_mask)[uVar5] & 1) != 0) {
    pcVar1 = OONF_CLASS_EVENT_NAME[evt];
    pcVar2 = (*c->to_keystring)(&buf,c,ptr);
    oonf_log(1,uVar5,"src/base/oonf_class.c",0x143,0,0,"Fire \'%s\' event for %s",pcVar1,pcVar2);
  }
  plVar6 = &c->_extensions;
LAB_00117223:
  do {
    while( true ) {
      plVar6 = plVar6->next;
      if (plVar6->prev == (c->_extensions).prev) {
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
          oonf_log(1,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x152,0,0,
                   "Fire event finished");
        }
        return;
      }
      if (evt == OONF_OBJECT_CHANGED) goto LAB_001172a4;
      if (evt == OONF_OBJECT_REMOVED) break;
      if ((evt == OONF_OBJECT_ADDED) && (plVar3 = plVar6[-2].prev, plVar3 != (list_entity *)0x0)) {
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) == 0) goto LAB_001172f5;
        plVar3 = (list_entity *)&plVar6[-2].prev;
        uVar4 = 0x146;
        goto LAB_001172d4;
      }
    }
    plVar3 = plVar6[-1].prev;
  } while (plVar3 == (list_entity *)0x0);
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    plVar3 = (list_entity *)&plVar6[-1].prev;
    uVar4 = 0x14a;
    goto LAB_001172d4;
  }
  goto LAB_001172f5;
LAB_001172a4:
  plVar3 = plVar6[-1].next;
  if (plVar3 != (list_entity *)0x0) {
    if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
      plVar3 = plVar6 + -1;
      uVar4 = 0x14e;
LAB_001172d4:
      oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",uVar4,0,0,"Fire listener %s",
               plVar6[-4].prev);
      plVar3 = plVar3->next;
    }
LAB_001172f5:
    (*(code *)plVar3)(ptr);
  }
  goto LAB_00117223;
}

Assistant:

void
oonf_class_event(struct oonf_class *c, void *ptr, enum oonf_class_event evt) {
  struct oonf_class_extension *ext;
#ifdef OONF_LOG_DEBUG_INFO
  struct oonf_objectkey_str buf;
#endif

  OONF_DEBUG(LOG_CLASS, "Fire '%s' event for %s", OONF_CLASS_EVENT_NAME[evt], c->to_keystring(&buf, c, ptr));
  list_for_each_element(&c->_extensions, ext, _node) {
    if (evt == OONF_OBJECT_ADDED && ext->cb_add != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_add(ptr);
    }
    else if (evt == OONF_OBJECT_REMOVED && ext->cb_remove != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_remove(ptr);
    }
    else if (evt == OONF_OBJECT_CHANGED && ext->cb_change != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_change(ptr);
    }
  }
  OONF_DEBUG(LOG_CLASS, "Fire event finished");
}